

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O0

void __thiscall write_point_le::operator()(write_point_le *this,way_point_le *point,xr_writer *w)

{
  xr_writer *w_local;
  way_point_le *point_local;
  write_point_le *this_local;
  
  xray_re::xr_writer::w_fvector3(w,&(point->super_way_point).position);
  xray_re::xr_writer::w_u32(w,(point->super_way_point).flags);
  xray_re::xr_writer::w_u16(w,point->id);
  xray_re::xr_writer::w_sz(w,(string *)point);
  return;
}

Assistant:

void operator()(const way_point_le& point, xr_writer& w) const {
	w.w_fvector3(point.position);
	w.w_u32(point.flags);
	w.w_u16(point.id);
	w.w_sz(point.name);
}